

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

int __thiscall IsoWriter::mkdir(IsoWriter *this,char *__path,__mode_t __mode)

{
  uint8_t objectId;
  FileEntryInfo *__s;
  FileEntryInfo *this_00;
  undefined4 in_register_00000014;
  allocator<char> local_61;
  string local_60;
  FileEntryInfo *local_30;
  FileEntryInfo *dir;
  FileEntryInfo *parent_local;
  char *name_local;
  IsoWriter *this_local;
  
  dir = (FileEntryInfo *)CONCAT44(in_register_00000014,__mode);
  if (this->m_rootDirInfo == (FileEntryInfo *)0x0) {
    this_local._0_4_ = 0;
  }
  else {
    if (dir == (FileEntryInfo *)0x0) {
      dir = this->m_rootDirInfo;
    }
    parent_local = (FileEntryInfo *)__path;
    name_local = (char *)this;
    this_00 = (FileEntryInfo *)operator_new(0xa8);
    objectId = this->m_objectUniqId;
    this->m_objectUniqId = objectId + '\x01';
    FileEntryInfo::FileEntryInfo(this_00,this,dir,objectId,Directory);
    __s = parent_local;
    local_30 = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,(char *)__s,&local_61);
    FileEntryInfo::setName(this_00,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    FileEntryInfo::addSubDir(dir,local_30);
    this_local._0_4_ = (int)local_30;
  }
  return (int)this_local;
}

Assistant:

FileEntryInfo *IsoWriter::mkdir(const char *name, FileEntryInfo *parent)
{
    if (!m_rootDirInfo)
        return nullptr;
    if (parent == nullptr)
        parent = m_rootDirInfo;

    const auto dir = new FileEntryInfo(this, parent, m_objectUniqId++, FileTypes::Directory);
    dir->setName(name);
    parent->addSubDir(dir);
    // m_sectorNum += 2;
    // m_systemStreamLBN = m_sectorNum; // last allocated sector
    return dir;
}